

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

int Alg::cal_k_max(vector<double,_std::allocator<double>_> *budget_list,double budget)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  pdVar2 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    uVar6 = (long)pdVar3 - (long)pdVar2 >> 3;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar2,pdVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar2);
  }
  pdVar2 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar7 == 0) {
    iVar5 = 0;
  }
  else {
    lVar7 = lVar7 >> 3;
    lVar8 = 0;
    iVar5 = 0;
    do {
      dVar1 = pdVar2[lVar8];
      uVar4 = (uint)(dVar1 < budget && 0.001 < ABS(dVar1));
      if ((-uVar4 & 1) != 0) {
        budget = budget - dVar1;
      }
      iVar5 = iVar5 + uVar4;
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  return iVar5;
}

Assistant:

int Alg::cal_k_max(std::vector<double> budget_list, double budget) {
    int count = 0;
    std::sort(budget_list.begin(), budget_list.end());
    for(int i = 0; i < budget_list.size(); i++) {
        if (budget > budget_list[i] && fabs(budget_list[i]) > 0.001) {
            budget = budget - budget_list[i];
            count = count + 1;
        }
    }
    return count;
}